

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O1

void __thiscall
ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
TestBody(ParticleArrayTest_Assignment_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
         *this)

{
  void *pvVar1;
  PositionType minPosition;
  PositionType minPosition_00;
  Particle<(pica::Dimension)3> particle;
  Particle<(pica::Dimension)3> particle_00;
  PositionType maxPosition;
  PositionType maxPosition_00;
  vector<double,_std::allocator<double>_> *__x;
  bool bVar2;
  bool bVar3;
  long lVar4;
  int iVar5;
  Particle *pPVar6;
  double *pdVar7;
  byte bVar8;
  PositionType position_1;
  PositionType position;
  double dVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined1 in_stack_fffffffffffffc38 [24];
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a8;
  AssertHelper local_3a0;
  char *local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  AssertionResult local_378;
  undefined8 local_368;
  vector<double,_std::allocator<double>_> *local_360 [3];
  ParticleArray local_348;
  ParticleArray local_270;
  ParticleArray local_198;
  Particle local_c0;
  Particle local_78;
  
  bVar8 = 0;
  local_360[2] = &local_348.factors;
  memset(&local_348,0,0xd8);
  local_360[1] = &local_198.factors;
  memset(&local_198,0,0xd8);
  local_360[0] = &local_270.factors;
  memset(&local_270,0,0xd8);
  iVar5 = 9;
  do {
    local_378.success_ = false;
    local_378._1_7_ = 0xc0240000000000;
    local_378.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
    local_368 = 0xc024000000000000;
    local_398 = (char *)0x4024000000000000;
    uStack_390 = 0x4024000000000000;
    local_388 = 0x4024000000000000;
    uVar14 = 0x4024000000000000;
    uVar12 = 0x4024000000000000;
    uVar13 = 0x4024000000000000;
    uVar11 = 0xc024000000000000;
    dVar9 = -10.0;
    uVar10 = 0xc024000000000000;
    minPosition.y = -10.0;
    minPosition.x = -10.0;
    minPosition.z = -10.0;
    maxPosition.y = 10.0;
    maxPosition.x = 10.0;
    maxPosition.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_78,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition,maxPosition);
    pPVar6 = &local_78;
    pdVar7 = (double *)&stack0xfffffffffffffc08;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar7 = (pPVar6->position).x;
      pPVar6 = (Particle *)((long)pPVar6 + (ulong)bVar8 * -0x10 + 8);
      pdVar7 = pdVar7 + (ulong)bVar8 * -2 + 1;
    }
    particle.position.y = (double)uVar10;
    particle.position.x = dVar9;
    particle.position.z = (double)uVar11;
    particle.p.x = (double)uVar12;
    particle.p.y = (double)uVar13;
    particle.p.z = (double)uVar14;
    particle.factor = (FactorType)in_stack_fffffffffffffc38._0_8_;
    particle.invGamma = (GammaType)in_stack_fffffffffffffc38._8_8_;
    particle.typeIndex = in_stack_fffffffffffffc38._16_2_;
    particle._66_6_ = in_stack_fffffffffffffc38._18_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *)&local_348,particle);
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  iVar5 = 0xb;
  do {
    local_378.success_ = false;
    local_378._1_7_ = 0xc0240000000000;
    local_378.message_.ptr_ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc024000000000000;
    local_368 = 0xc024000000000000;
    local_398 = (char *)0x4024000000000000;
    uStack_390 = 0x4024000000000000;
    local_388 = 0x4024000000000000;
    uVar14 = 0x4024000000000000;
    uVar12 = 0x4024000000000000;
    uVar13 = 0x4024000000000000;
    uVar11 = 0xc024000000000000;
    dVar9 = -10.0;
    uVar10 = 0xc024000000000000;
    minPosition_00.y = -10.0;
    minPosition_00.x = -10.0;
    minPosition_00.z = -10.0;
    maxPosition_00.y = 10.0;
    maxPosition_00.x = 10.0;
    maxPosition_00.z = 10.0;
    BaseParticleFixture<pica::Particle<(pica::Dimension)3>_>::randomParticle
              (&local_c0,(BaseParticleFixture<pica::Particle<(pica::Dimension)3>_> *)this,
               minPosition_00,maxPosition_00);
    pPVar6 = &local_c0;
    pdVar7 = (double *)&stack0xfffffffffffffc08;
    for (lVar4 = 9; lVar4 != 0; lVar4 = lVar4 + -1) {
      *pdVar7 = (pPVar6->position).x;
      pPVar6 = (Particle *)((long)pPVar6 + (ulong)bVar8 * -0x10 + 8);
      pdVar7 = pdVar7 + (ulong)bVar8 * -2 + 1;
    }
    particle_00.position.y = (double)uVar10;
    particle_00.position.x = dVar9;
    particle_00.position.z = (double)uVar11;
    particle_00.p.x = (double)uVar12;
    particle_00.p.y = (double)uVar13;
    particle_00.p.z = (double)uVar14;
    particle_00.factor = (FactorType)in_stack_fffffffffffffc38._0_8_;
    particle_00.invGamma = (GammaType)in_stack_fffffffffffffc38._8_8_;
    particle_00.typeIndex = in_stack_fffffffffffffc38._16_2_;
    particle_00._66_6_ = in_stack_fffffffffffffc38._18_6_;
    pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>>::
    pushBack<pica::Particle<(pica::Dimension)3>>
              ((ParticleArraySoA<pica::Particle<(pica::Dimension)3>> *)&local_198,particle_00);
    __x = local_360[2];
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  lVar4 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_198.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  lVar4 = 0x48;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_198.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x90);
  std::vector<double,_std::allocator<double>_>::operator=(local_360[1],__x);
  std::vector<double,_std::allocator<double>_>::operator=(&local_198.invGammas,&local_348.invGammas)
  ;
  std::vector<short,_std::allocator<short>_>::operator=(&local_198.typeIndex,&local_348.typeIndex);
  lVar4 = 0;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_270.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x48);
  lVar4 = 0x48;
  do {
    std::vector<double,_std::allocator<double>_>::operator=
              ((vector<double,_std::allocator<double>_> *)
               ((long)&local_270.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4),
               (vector<double,_std::allocator<double>_> *)
               ((long)&local_348.positions[0].super__Vector_base<double,_std::allocator<double>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar4));
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x90);
  std::vector<double,_std::allocator<double>_>::operator=(local_360[0],__x);
  std::vector<double,_std::allocator<double>_>::operator=(&local_270.invGammas,&local_348.invGammas)
  ;
  std::vector<short,_std::allocator<short>_>::operator=(&local_270.typeIndex,&local_348.typeIndex);
  bVar2 = ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
          eqParticleArrays(&this->
                            super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
                           ,&local_348,&local_198);
  local_378.success_ = bVar2;
  local_378.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (bVar2) {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_378.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::Message::Message((Message *)&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_398,&local_378,"this->eqParticleArrays(particles, particlesCopy)",
               "false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x39,local_398);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_398 != (char *)0x0) {
      operator_delete__(local_398);
    }
    if (local_3a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar3 = testing::internal::IsTrue(true);
      if ((bVar3) &&
         (local_3a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a8.ptr_ + 8))();
      }
      local_3a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_378.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (!bVar2) goto LAB_00196f00;
  }
  bVar2 = ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>::
          eqParticleArrays(&this->
                            super_ParticleArrayTest<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)3>_>_>
                           ,&local_348,&local_270);
  local_378.success_ = bVar2;
  local_378.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  if (!bVar2) {
    testing::Message::Message((Message *)&local_3a8);
    testing::internal::GetBoolAssertionFailureMessage
              ((internal *)&local_398,&local_378,
               "this->eqParticleArrays(particles, particlesAnotherCopy)","false","true");
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x3a,local_398);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_3a8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    if (local_398 != (char *)0x0) {
      operator_delete__(local_398);
    }
    if (local_3a8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_3a8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_3a8.ptr_ + 8))();
      }
      local_3a8.ptr_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_378.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
LAB_00196f00:
  if (local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_270.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_270.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_270.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_270.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar4 = 0x88;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_348.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_270.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar4) -
                             (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0x40);
  lVar4 = 0x48;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_348.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_270.positions + lVar4 + -8) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  if (local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_198.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_198.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_198.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_198.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar4 = 0x88;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_270.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_finish + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_198.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar4) -
                             (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0x40);
  lVar4 = 0x48;
  do {
    pvVar1 = *(void **)((long)&(((vector<short,_std::allocator<short>_> *)(local_270.ps + 5))->
                               super__Vector_base<short,_std::allocator<short>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_198.positions + lVar4 + -8) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  if (local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.typeIndex.super__Vector_base<short,_std::allocator<short>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.invGammas.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_348.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.factors.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_348.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_348.factors.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  lVar4 = 0x88;
  do {
    pvVar1 = *(void **)((long)local_360 + lVar4 + 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&local_348.positions[0].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data._M_start + lVar4) -
                             (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0x40);
  lVar4 = 0x48;
  do {
    pvVar1 = *(void **)((long)local_360 + lVar4);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_348.positions + lVar4 + -8) - (long)pvVar1);
    }
    lVar4 = lVar4 + -0x18;
  } while (lVar4 != 0);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, Assignment)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles, particlesCopy, particlesAnotherCopy;
    for (int i = 0; i < 9; i++)
        particles.pushBack(this->randomParticle());
    for (int i = 0; i < 11; i++)
        particlesCopy.pushBack(this->randomParticle());
    particlesCopy = particles;
    particlesAnotherCopy = particles;
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesCopy));
    ASSERT_TRUE(this->eqParticleArrays(particles, particlesAnotherCopy));
}